

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

Token * __thiscall llbuild::ninja::Lexer::setIdentifierTokenKind(Lexer *this,Token *result)

{
  int *__s2;
  int iVar1;
  Kind KVar2;
  Kind KVar3;
  Kind KVar4;
  
  __s2 = (int *)result->start;
  KVar3 = *(int *)&this->bufferPos - (int)__s2;
  switch(KVar3) {
  case Indentation:
    if (*__s2 == 0x656c7572) {
      KVar2 = KWRule;
    }
    else {
      if (*__s2 != 0x6c6f6f70) break;
      KVar2 = KWPool;
    }
    KVar4 = Indentation;
    goto LAB_0012a432;
  case Identifier:
    iVar1 = bcmp("build",__s2,5);
    if (iVar1 == 0) {
      KVar4 = Identifier;
      KVar2 = KWBuild;
      goto LAB_0012a432;
    }
    break;
  case KWDefault:
    iVar1 = bcmp("default",__s2,7);
    KVar4 = KWDefault;
    KVar2 = KVar4;
    if (iVar1 == 0) goto LAB_0012a432;
    iVar1 = bcmp("include",__s2,7);
    if (iVar1 == 0) {
      KVar2 = KWInclude;
      goto LAB_0012a432;
    }
    break;
  case KWInclude:
    iVar1 = bcmp("subninja",__s2,7);
    if (iVar1 == 0) {
      KVar4 = KWInclude;
      KVar2 = KWKindLast;
      goto LAB_0012a432;
    }
  }
  KVar2 = Identifier;
  KVar4 = KVar3;
LAB_0012a432:
  result->tokenKind = KVar2;
  result->length = KVar4;
  return result;
}

Assistant:

Token& Lexer::setIdentifierTokenKind(Token& result) const {
  unsigned length = bufferPos - result.start;
  switch (length) {
  case 4:
    if (memcmp("rule", result.start, 4) == 0)
      return setTokenKind(result, Token::Kind::KWRule);
    if (memcmp("pool", result.start, 4) == 0)
      return setTokenKind(result, Token::Kind::KWPool);
    break;

  case 5:
    if (memcmp("build", result.start, 5) == 0)
      return setTokenKind(result, Token::Kind::KWBuild);
    break;

  case 7:
    if (memcmp("default", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWDefault);
    if (memcmp("include", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWInclude);
    break;

  case 8:
    if (memcmp("subninja", result.start, 7) == 0)
      return setTokenKind(result, Token::Kind::KWSubninja);
    break;
  }

  return setTokenKind(result, Token::Kind::Identifier);
}